

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O0

string * __thiscall
jaegertracing::propagation::
Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>::
encodeValue(string *__return_storage_ptr__,
           Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
           *this,string *str)

{
  string *str_local;
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string encodeValue(const std::string& str) const
    {
        return str;
    }